

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O2

Operand __thiscall flow::TargetCodeGenerator::getConstantInt(TargetCodeGenerator *this,Value *value)

{
  FILE *__stream;
  long lVar1;
  allocator<char> local_31;
  undefined8 local_30 [4];
  
  if (value != (Value *)0x0) {
    lVar1 = __dynamic_cast(value,&Value::typeinfo,
                           &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0);
    if (lVar1 != 0) {
      return *(Operand *)&value[1]._vptr_Value;
    }
  }
  __stream = _stderr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"Must be ConstantInt",&local_31);
  fprintf(__stream,"%s\n",local_30[0]);
  std::__cxx11::string::~string((string *)local_30);
  abort();
}

Assistant:

Operand TargetCodeGenerator::getConstantInt(Value* value) {
  FLOW_ASSERT(dynamic_cast<ConstantInt*>(value) != nullptr, "Must be ConstantInt");
  return static_cast<ConstantInt*>(value)->get();
}